

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEVPCMacAlgorithm.cpp
# Opt level: O2

bool __thiscall OSSLEVPCMacAlgorithm::signInit(OSSLEVPCMacAlgorithm *this,SymmetricKey *key)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  CMAC_CTX *ctx;
  undefined4 extraout_var_00;
  uchar *key_00;
  undefined4 extraout_var_01;
  size_t keylen;
  ulong e;
  char *pcVar4;
  ByteString dummy;
  
  bVar1 = MacAlgorithm::signInit(&this->super_MacAlgorithm,key);
  if (bVar1) {
    iVar2 = (*(this->super_MacAlgorithm)._vptr_MacAlgorithm[0xc])(this);
    if ((EVP_CIPHER *)CONCAT44(extraout_var,iVar2) == (EVP_CIPHER *)0x0) {
      softHSMLog(3,"signInit",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPCMacAlgorithm.cpp"
                 ,0x3c,"Invalid sign mac algorithm");
      ByteString::ByteString(&dummy);
      MacAlgorithm::signFinal(&this->super_MacAlgorithm,&dummy);
    }
    else {
      ctx = CMAC_CTX_new();
      this->curCTX = (CMAC_CTX *)ctx;
      if (ctx == (CMAC_CTX *)0x0) {
        softHSMLog(3,"signInit",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPCMacAlgorithm.cpp"
                   ,0x48,"Failed to allocate space for CMAC_CTX");
        return false;
      }
      iVar3 = (*(key->super_Serialisable)._vptr_Serialisable[4])(key);
      key_00 = ByteString::const_byte_str((ByteString *)CONCAT44(extraout_var_00,iVar3));
      iVar3 = (*(key->super_Serialisable)._vptr_Serialisable[4])(key);
      keylen = ByteString::size((ByteString *)CONCAT44(extraout_var_01,iVar3));
      iVar2 = CMAC_Init(ctx,key_00,keylen,(EVP_CIPHER *)CONCAT44(extraout_var,iVar2),(ENGINE *)0x0);
      if (iVar2 != 0) {
        return true;
      }
      e = ERR_get_error();
      pcVar4 = ERR_error_string(e,(char *)0x0);
      softHSMLog(3,"signInit",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPCMacAlgorithm.cpp"
                 ,0x50,"CMAC_Init failed: %s",pcVar4);
      CMAC_CTX_free((CMAC_CTX *)this->curCTX);
      this->curCTX = (CMAC_CTX *)0x0;
      ByteString::ByteString(&dummy);
      MacAlgorithm::signFinal(&this->super_MacAlgorithm,&dummy);
    }
    ByteString::~ByteString(&dummy);
  }
  return false;
}

Assistant:

bool OSSLEVPCMacAlgorithm::signInit(const SymmetricKey* key)
{
	// Call the superclass initialiser
	if (!MacAlgorithm::signInit(key))
	{
		return false;
	}

	// Determine the cipher class
	const EVP_CIPHER* cipher = getEVPCipher();
	if (cipher == NULL)
	{
		ERROR_MSG("Invalid sign mac algorithm");

		ByteString dummy;
		MacAlgorithm::signFinal(dummy);

		return false;
	}

	// Initialize the context
	curCTX = CMAC_CTX_new();
	if (curCTX == NULL)
	{
		ERROR_MSG("Failed to allocate space for CMAC_CTX");

		return false;
	}

	// Initialize EVP signing
	if (!CMAC_Init(curCTX, key->getKeyBits().const_byte_str(), key->getKeyBits().size(), cipher, NULL))
	{
		ERROR_MSG("CMAC_Init failed: %s", ERR_error_string(ERR_get_error(), NULL));

		CMAC_CTX_free(curCTX);
		curCTX = NULL;

		ByteString dummy;
		MacAlgorithm::signFinal(dummy);

		return false;
	}

	return true;
}